

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oarchive_suite.cpp
# Opt level: O1

void compact_array_suite::test_uint32_many(void)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  output_type expected [18];
  undefined1 local_c6 [14];
  uint32_t value [4];
  oarchive ar;
  
  result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  trial::protocol::bintoken::oarchive::
  oarchive<std::vector<unsigned_char,std::allocator<unsigned_char>>>(&ar,&result);
  value[0] = 0;
  value[1] = 0x7fffffff;
  value[2] = 0x80000000;
  value[3] = 0xffffffff;
  trial::protocol::bintoken::detail::basic_encoder<16UL>::array(&ar.writer.encoder,(type *)value,4);
  expected[0] = 0xac;
  expected[1] = '\x10';
  expected[2] = '\0';
  expected[3] = '\0';
  expected[4] = '\0';
  expected[5] = '\0';
  expected[6] = 0xff;
  expected[7] = 0xff;
  expected[8] = 0xff;
  expected[9] = '\x7f';
  expected[10] = '\0';
  expected[0xb] = '\0';
  expected[0xc] = '\0';
  expected[0xd] = 0x80;
  expected[0xe] = 0xff;
  expected[0xf] = 0xff;
  expected[0x10] = 0xff;
  expected[0x11] = 0xff;
  boost::detail::
  test_all_with_impl<std::ostream,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char*,std::equal_to<unsigned_char>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/oarchive_suite.cpp"
             ,0x201,"void compact_array_suite::test_uint32_many()",
             result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,
             result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish,expected,local_c6);
  ar.super_common_oarchive<trial::protocol::bintoken::oarchive>._0_8_ = &PTR_vsave_00121760;
  std::
  _Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ::~_Deque_base((_Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
                  *)&ar.writer.stack);
  (**(code **)ar.writer.encoder.storage._0_8_)(&ar.writer);
  boost::archive::detail::basic_oarchive::~basic_oarchive((basic_oarchive *)&ar);
  if (result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void test_zero()
{
    std::vector<output_type> result;
    format::oarchive ar(result);
    int value = 0;
    ar << value;
    TRIAL_PROTOCOL_TEST_EQUAL(result.size(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(result[0], 0x00);
}